

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS0.cpp
# Opt level: O2

bool __thiscall RTIMULSM9DS0::setAccelCTRL1(RTIMULSM9DS0 *this)

{
  uint uVar1;
  RTIMUSettings *this_00;
  bool bVar2;
  
  this_00 = (this->super_RTIMU).m_settings;
  uVar1 = this_00->m_LSM9DS0AccelSampleRate;
  if (uVar1 < 0xb) {
    bVar2 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_accelCompassSlaveAddr,' ',
                               (char)uVar1 << 4 | 7,"Failed to set LSM9DS0 accell CTRL1");
    return bVar2;
  }
  fprintf(_stderr,"Illegal LSM9DS0 accel sample rate code %d\n");
  return false;
}

Assistant:

bool RTIMULSM9DS0::setAccelCTRL1()
{
    unsigned char ctrl1;

    if ((m_settings->m_LSM9DS0AccelSampleRate < 0) || (m_settings->m_LSM9DS0AccelSampleRate > 10)) {
        HAL_ERROR1("Illegal LSM9DS0 accel sample rate code %d\n", m_settings->m_LSM9DS0AccelSampleRate);
        return false;
    }

    ctrl1 = (m_settings->m_LSM9DS0AccelSampleRate << 4) | 0x07;

    return m_settings->HALWrite(m_accelCompassSlaveAddr,  LSM9DS0_CTRL1, ctrl1, "Failed to set LSM9DS0 accell CTRL1");
}